

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

atom * findTouchingAtoms(atom *src,atom *head,atomBins *abins,float probeRad,int targFlg,int *ok)

{
  bool local_79;
  int local_78;
  int local_74;
  int kmax;
  int jmax;
  int imax;
  int kmin;
  int jmin;
  int imin;
  int jz;
  int jy;
  int jx;
  int targcount;
  int nearpt;
  int k;
  int j;
  int i;
  atom *a;
  int *ok_local;
  int targFlg_local;
  float probeRad_local;
  atomBins *abins_local;
  atom *head_local;
  atom *src_local;
  
  _j = (atomPtr)0x0;
  k = 0;
  nearpt = 0;
  targcount = 0;
  jx = 0;
  jy = 0;
  jz = src->ix;
  imin = src->iy;
  jmin = src->iz;
  a = (atom *)ok;
  ok_local._0_4_ = targFlg;
  ok_local._4_4_ = probeRad;
  _targFlg_local = abins;
  abins_local = (atomBins *)head;
  head_local = src;
  if (src->binSerialNum != abins->binSerialNum) {
    if ((((((src->loc).x < (abins->min).x - (double)abins->delta) ||
          ((src->loc).y < (abins->min).y - (double)abins->delta)) ||
         ((src->loc).z < (abins->min).z - (double)abins->delta)) ||
        (((abins->max).x + (double)abins->delta < (src->loc).x ||
         ((abins->max).y + (double)abins->delta < (src->loc).y)))) ||
       ((abins->max).z + (double)abins->delta < (src->loc).z)) {
      return (atom *)0x0;
    }
    binLoc(&src->loc,&jz,&imin,&jmin,abins);
  }
  kmin = jz + -1;
  kmax = jz + 1;
  imax = imin + -1;
  local_74 = imin + 1;
  jmax = jmin + -1;
  local_78 = jmin + 1;
  if (kmin < 1) {
    kmin = 1;
  }
  if (imax < 1) {
    imax = 1;
  }
  if (jmax < 1) {
    jmax = 1;
  }
  if (_targFlg_local->nx + -2 < kmax) {
    kmax = _targFlg_local->nx + -2;
  }
  if (_targFlg_local->ny + -2 < local_74) {
    local_74 = _targFlg_local->ny + -2;
  }
  if (_targFlg_local->nz + -2 < local_78) {
    local_78 = _targFlg_local->nz + -2;
  }
  for (k = kmin; k <= kmax; k = k + 1) {
    for (nearpt = imax; nearpt <= local_74; nearpt = nearpt + 1) {
      for (targcount = jmax; targcount <= local_78; targcount = targcount + 1) {
        for (_j = _targFlg_local->list[k][nearpt][targcount]; _j != (atom *)0x0; _j = _j->nextInBin)
        {
          if ((((head_local->r->model == _j->r->model) &&
               ((modelLimit < 2 || (head_local->r->model == modelToProcess)))) &&
              ((head_local->altConf == _j->altConf ||
               ((head_local->altConf == ' ' || (_j->altConf == ' ')))))) &&
             (jx = atomsClose(head_local,_j,ok_local._4_4_), jx != 0)) {
            _j->mark = 0;
            _j->scratch = (atom_t *)abins_local;
            abins_local = (atomBins *)_j;
            if ((_j->flags & (uint)ok_local) != 0) {
              jy = jy + 1;
            }
          }
        }
      }
    }
  }
  head_local->mark = 0;
  local_79 = (uint)ok_local != 0 && jy < 1;
  *(uint *)&a->next = (uint)((local_79 ^ 0xffU) & 1);
  return (atom *)abins_local;
}

Assistant:

atom* findTouchingAtoms(atom *src, atom *head, atomBins *abins,
			   float probeRad, int targFlg, int *ok)
{/*findTouchingAtoms()*/
   atom *a = NULL;
   int i = 0, j = 0, k = 0, nearpt = 0, targcount = 0;
   int jx = (src->ix), jy = (src->iy), jz = (src->iz);
   int imin = 0, jmin = 0, kmin = 0;
   int imax = 0, jmax = 0, kmax = 0;

   if (src->binSerialNum != abins->binSerialNum)
   {/*in foreign bins */
      /*dcr?: why do they have to be in foreign==different bins??*/
      /*this requirement seems not to affect loss of close clashes*/

      /* must look up the positions */

      if(  (src->loc.x < (abins->min.x - abins->delta))
	|| (src->loc.y < (abins->min.y - abins->delta))
	|| (src->loc.z < (abins->min.z - abins->delta))
	|| (src->loc.x > (abins->max.x + abins->delta))
	|| (src->loc.y > (abins->max.y + abins->delta))
	|| (src->loc.z > (abins->max.z + abins->delta)) )
      {
	 return NULL; /* nothing anywhere nearby */
      }
      binLoc(&(src->loc), &jx, &jy, &jz, abins);

#ifdef DEBUG_A2B
fprintf(stderr, "f(%c != %c) %s%d %s [%d, %d, %d] <1..%d, 1..%d, 1..%d>\n",
   src->binSerialNum, abins->binSerialNum,
   src->r->resname, src->r->resid, src->atomname, jx, jy, jz, abins->nx-2, abins->ny-2, abins->nz-2);
#endif

   }/*in foreign bins */

   imin = jx-1; imax = jx+1; /* bin ranges */
   jmin = jy-1; jmax = jy+1;
   kmin = jz-1; kmax = jz+1;

   /* trim any excess edges */
   if (imin < 1)               { imin = 1; }
   if (jmin < 1)               { jmin = 1; }
   if (kmin < 1)               { kmin = 1; }
   if (imax > (abins->nx - 2)) { imax = (abins->nx - 2); }
   if (jmax > (abins->ny - 2)) { jmax = (abins->ny - 2); }
   if (kmax > (abins->nz - 2)) { kmax = (abins->nz - 2); }

   for(i = imin; i <= imax; i++) {
      for(j = jmin; j <= jmax; j++) {
         for(k = kmin; k <= kmax; k++) {

	    for(a = abins->list[i][j][k]; a; a = a->nextInBin) {

               /*Lmodeltest for interaction of diff. models 041112*/
               /*050121 Lmodeltest superseded, mage sends model# */
               /*...within subroutine findTouchingAtoms()... */
	       if( (src->r->model != a->r->model) ) { continue; }
               if( modelLimit > 1 ) /*041114*/
               {/*looping through multiple models*/
                  if(src->r->model != modelToProcess) { continue; }
               }

               /*if (( src->r  == a->r)            && -- alternate      */
                                                    /* alternate      */
	       if (( src->altConf != a->altConf) && /* conformations  */
	           ( src->altConf != ' ')        && /* don't interact */
	           (   a->altConf != ' ')     ) { continue; }
            
    
/*nearpt seems to be essential to get any dots or spikes */
/*...seems not to be where too-close atoms fail to get any dots or spikes*/
	       nearpt = atomsClose(src, a, probeRad);/*only call to atomsClose*/
	       if (nearpt)
               {/*add this atom to the linked-list of those touching src atom*/
		  a->mark = 0;       /* clear the bonding marker.   */
		  a->scratch = head; /* link using scratch pointers */
		  head = a;          /* with <a> at head of list    */

		  if (a->flags & targFlg) { targcount++; }
           }
        }
     }
    }
   }
   src->mark = 0;       /* clear the src atom bonding marker.   */

   *ok = !(targFlg && (targcount < 1));

   return head;
}